

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void test_ADynArray_append_failure_bufferExpansionFailed_fn(int _i)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  void *_ck_x_5;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_3;
  char *_ck_x_4;
  void *_ck_x_3;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  code *pcStack_68;
  char c;
  private_ACUtilsTest_ADynArray_CharArray array;
  int _i_local;
  
  array.buffer._4_4_ = _i;
  memcpy(&stack0xffffffffffffff98,&PTR_private_ACUtilsTest_ADynArray_realloc_001a7ad0,0x30);
  array.growStrategy = (ACUtilsGrowStrategy)0x5;
  array.deallocator = private_ACUtilsTest_ADynArray_growStrategy;
  array.size = 5;
  private_ACUtilsTest_ADynArray_reallocFail = false;
  array.capacity = (*pcStack_68)(0,6);
  *(undefined4 *)array.capacity = 0x33323130;
  *(undefined2 *)(array.capacity + 4) = 0x34;
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  private_ACUtilsTest_ADynArray_reallocFail = true;
  _ck_x._7_1_ = 0;
  bVar1 = private_ACUtils_ADynArray_insertArray
                    (&stack0xffffffffffffff98,0xffffffffffffffff,(void *)((long)&_ck_x + 7),1,1);
  if ((ulong)bVar1 != 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x513,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "private_ACUtils_ADynArray_insertArray(&array, -1, &(c), 1, sizeof(*(&array)->buffer)) == false"
                      ,
                      "private_ACUtils_ADynArray_insertArray(&array, -1, &(c), 1, sizeof(*(&array)->buffer))"
                      ,(ulong)bVar1,"false",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x513);
  if (array.growStrategy != (ACUtilsGrowStrategy)0x5) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x514,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","array.size == 5","array.size"
                      ,array.growStrategy,"5",5,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x514);
  if (array.size != 5) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x515,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","array.capacity == 5",
                      "array.capacity",array.size,"5",5,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x515);
  if (array.capacity != 0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x516);
    _ck_y_s = (char *)array.capacity;
    if (array.capacity == 0) {
      _ck_y_q = "";
      _ck_y_s = "(null)";
    }
    else {
      _ck_y_q = "\"";
      iVar2 = strcmp("01234",(char *)array.capacity);
      if (iVar2 == 0) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x517);
        if (array.deallocator != (ACUtilsDeallocator)0x0) {
          sVar3 = 0x518;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x518);
          (*array.reallocator)((void *)array.capacity,sVar3);
          return;
        }
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x518,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x","(void*) array.growStrategy != NULL",
                          "(void*) array.growStrategy",0,0);
      }
    }
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x517,
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                      "array.buffer == \"01234\"","array.buffer",_ck_y_q,_ck_y_s,_ck_y_q,"\"01234\""
                      ,"\"","01234","\"",0);
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x516,"Assertion \'_ck_x != NULL\' failed","Assertion \'%s\' failed: %s == %#x"
                    ,"(void*) array.buffer != NULL","(void*) array.buffer",0,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_append_failure_bufferExpansionFailed)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 5;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity + 1);
    memcpy(array.buffer, "01234", 6);
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    char c = '\0';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_append(&array, c), false);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 5);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 5);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01234");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.deallocator(array.buffer);
}